

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv4transmitter.cpp
# Opt level: O0

void __thiscall jrtplib::RTPUDPv4Transmitter::FlushPackets(RTPUDPv4Transmitter *this)

{
  RTPRawPacket *obj;
  bool bVar1;
  reference ppRVar2;
  RTPMemoryManager *mgr;
  iterator local_38;
  _List_const_iterator<jrtplib::RTPRawPacket_*> local_30;
  iterator local_28;
  _List_const_iterator<jrtplib::RTPRawPacket_*> local_20;
  _List_const_iterator<jrtplib::RTPRawPacket_*> local_18;
  const_iterator it;
  RTPUDPv4Transmitter *this_local;
  
  it._M_node = (_List_node_base *)this;
  std::_List_const_iterator<jrtplib::RTPRawPacket_*>::_List_const_iterator(&local_18);
  local_28._M_node =
       (_List_node_base *)
       std::__cxx11::list<jrtplib::RTPRawPacket_*,_std::allocator<jrtplib::RTPRawPacket_*>_>::begin
                 (&this->rawpacketlist);
  std::_List_const_iterator<jrtplib::RTPRawPacket_*>::_List_const_iterator(&local_20,&local_28);
  local_18._M_node = local_20._M_node;
  while( true ) {
    local_38._M_node =
         (_List_node_base *)
         std::__cxx11::list<jrtplib::RTPRawPacket_*,_std::allocator<jrtplib::RTPRawPacket_*>_>::end
                   (&this->rawpacketlist);
    std::_List_const_iterator<jrtplib::RTPRawPacket_*>::_List_const_iterator(&local_30,&local_38);
    bVar1 = std::operator!=(&local_18,&local_30);
    if (!bVar1) break;
    ppRVar2 = std::_List_const_iterator<jrtplib::RTPRawPacket_*>::operator*(&local_18);
    obj = *ppRVar2;
    mgr = RTPMemoryObject::GetMemoryManager((RTPMemoryObject *)this);
    RTPDelete<jrtplib::RTPRawPacket>(obj,mgr);
    std::_List_const_iterator<jrtplib::RTPRawPacket_*>::operator++(&local_18);
  }
  std::__cxx11::list<jrtplib::RTPRawPacket_*,_std::allocator<jrtplib::RTPRawPacket_*>_>::clear
            (&this->rawpacketlist);
  return;
}

Assistant:

void RTPUDPv4Transmitter::FlushPackets()
{
	std::list<RTPRawPacket*>::const_iterator it;

	for (it = rawpacketlist.begin() ; it != rawpacketlist.end() ; ++it)
		RTPDelete(*it,GetMemoryManager());
	rawpacketlist.clear();
}